

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O0

void emit_label(c2m_ctx_t c2m_ctx,node_t_conflict r)

{
  node_t_conflict pnVar1;
  node_t_conflict pnVar2;
  MIR_insn_t_conflict pMVar3;
  node_t_conflict labels;
  node_t_conflict r_local;
  c2m_ctx_t c2m_ctx_local;
  
  pnVar1 = DLIST_node_t_head(&(r->u).ops);
  if (pnVar1->code != N_LIST) {
    __assert_fail("labels->code == N_LIST",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                  ,0x2aee,"void emit_label(c2m_ctx_t, node_t)");
  }
  pnVar2 = DLIST_node_t_head(&(pnVar1->u).ops);
  if (pnVar2 != (node_t_conflict)0x0) {
    if (pnVar1->attr == (void *)0x0) {
      pMVar3 = MIR_new_label(c2m_ctx->ctx);
      pnVar1->attr = pMVar3;
    }
    emit_label_insn_opt(c2m_ctx,(MIR_insn_t_conflict)pnVar1->attr);
  }
  return;
}

Assistant:

static void emit_label (c2m_ctx_t c2m_ctx, node_t r) {
  node_t labels = NL_HEAD (r->u.ops);

  assert (labels->code == N_LIST);
  if (NL_HEAD (labels->u.ops) == NULL) return;
  if (labels->attr == NULL) labels->attr = MIR_new_label (c2m_ctx->ctx);
  emit_label_insn_opt (c2m_ctx, labels->attr);
}